

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  bool bVar1;
  undefined1 uVar2;
  DescriptorPool *in_RDX;
  Tables *in_RSI;
  Symbol SVar3;
  MutexLockMaybe lock;
  string *in_stack_00000080;
  ReaderMutexLock lock_1;
  Symbol result;
  Mutex *in_stack_ffffffffffffff48;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffff60;
  undefined4 uStack_64;
  undefined4 uStack_54;
  string *in_stack_ffffffffffffffd0;
  Symbol local_10;
  
  if ((in_RSI->pending_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    internal::MutexLock::MutexLock
              ((MutexLock *)in_stack_ffffffffffffff50.descriptor,in_stack_ffffffffffffff48);
    bVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x4b1794);
    if ((bVar1) &&
       (bVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x4b17ab), bVar1)) {
      SVar3 = FindSymbol((Tables *)in_stack_ffffffffffffff60.descriptor,
                         (string *)
                         CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT24(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58))));
      local_10.field_1 = SVar3.field_1;
      local_10.type = SVar3.type;
      bVar1 = Symbol::IsNull(&local_10);
      if (bVar1) goto LAB_004b1835;
      bVar1 = true;
    }
    else {
LAB_004b1835:
      bVar1 = false;
    }
    internal::MutexLock::~MutexLock((MutexLock *)0x4b184a);
    if (bVar1) goto LAB_004b1a2c;
  }
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)in_stack_ffffffffffffff50.descriptor,in_stack_ffffffffffffff48);
  if ((in_RSI->pending_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4b188d);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4b189b);
  }
  SVar3 = FindSymbol((Tables *)in_stack_ffffffffffffff60.descriptor,
                     (string *)
                     CONCAT17(in_stack_ffffffffffffff5f,
                              CONCAT16(in_stack_ffffffffffffff5e,
                                       CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                                      )));
  local_10.field_1 = SVar3.field_1;
  local_10.type = SVar3.type;
  bVar1 = Symbol::IsNull(&local_10);
  if ((bVar1) && ((in_RSI->known_bad_files_)._M_h._M_buckets != (__buckets_ptr)0x0)) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4b1918);
    SVar3 = FindByNameHelper(in_RSI,in_RDX,in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffff60 = SVar3.field_1;
    local_10._0_8_ = CONCAT44(uStack_54,SVar3.type);
    local_10.field_1 = in_stack_ffffffffffffff60;
  }
  uVar2 = Symbol::IsNull(&local_10);
  if (((bool)uVar2) &&
     (bVar1 = TryFindSymbolInFallbackDatabase((DescriptorPool *)lock_1.mu_,in_stack_00000080), bVar1
     )) {
    SVar3 = FindSymbol((Tables *)in_stack_ffffffffffffff60.descriptor,
                       (string *)
                       CONCAT17(uVar2,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffff5c,
                                                              in_stack_ffffffffffffff58))));
    in_stack_ffffffffffffff50 = SVar3.field_1;
    local_10._0_8_ = CONCAT44(uStack_64,SVar3.type);
    local_10.field_1 = in_stack_ffffffffffffff50;
  }
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)in_stack_ffffffffffffff50.descriptor);
LAB_004b1a2c:
  SVar3._0_8_ = local_10._0_8_ & 0xffffffff;
  SVar3.field_1.descriptor = local_10.field_1.descriptor;
  return SVar3;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                const std::string& name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}